

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O0

int test_json(test_scope *scope,char *json,char *expect,int expect_err,
             flatcc_json_parser_flags_t parse_flags,flatcc_json_printer_flags_t print_flags,int line
             )

{
  FILE *pFVar1;
  int iVar2;
  size_t bufsiz;
  char *pcVar3;
  int local_28c;
  undefined1 local_288 [4];
  int i;
  flatcc_json_printer_t printer_ctx;
  flatcc_json_parser_t parser_ctx;
  flatcc_builder_t *B;
  flatcc_builder_t builder;
  size_t buf_size;
  size_t flatbuffer_size;
  char *buf;
  void *flatbuffer;
  int local_30;
  int err;
  int ret;
  flatcc_json_printer_flags_t print_flags_local;
  flatcc_json_parser_flags_t parse_flags_local;
  int expect_err_local;
  char *expect_local;
  char *json_local;
  test_scope *scope_local;
  
  local_30 = -1;
  buf = (char *)0x0;
  flatbuffer_size = 0;
  err = print_flags;
  ret = parse_flags;
  print_flags_local = expect_err;
  _parse_flags_local = expect;
  expect_local = json;
  json_local = (char *)scope;
  flatcc_builder_init((flatcc_builder_t *)&B);
  flatcc_json_printer_init_dynamic_buffer((flatcc_json_printer_t *)local_288,0);
  flatcc_json_printer_set_flags((flatcc_json_printer_t *)local_288,err);
  pcVar3 = expect_local;
  bufsiz = strlen(expect_local);
  flatbuffer._4_4_ =
       flatcc_json_parser_table_as_root
                 ((flatcc_builder_t *)&B,(flatcc_json_parser_t *)&printer_ctx.flush,pcVar3,bufsiz,
                  ret,*(char **)json_local,*(flatcc_json_parser_table_f **)(json_local + 8));
  pFVar1 = _stderr;
  if (flatbuffer._4_4_ == print_flags_local) {
    if (print_flags_local != 0) {
      local_30 = 0;
      goto LAB_00107634;
    }
    buf = (char *)flatcc_builder_finalize_aligned_buffer((flatcc_builder_t *)&B,&buf_size);
    local_30 = flatcc_verify_table_as_root
                         (buf,buf_size,*(char **)json_local,
                          *(flatcc_table_verifier_f **)(json_local + 0x18));
    pFVar1 = _stderr;
    if (local_30 == 0) {
      flatcc_json_printer_table_as_root
                ((flatcc_json_printer_t *)local_288,buf,buf_size,*(char **)json_local,
                 *(flatcc_json_printer_table_f **)(json_local + 0x10));
      flatbuffer_size =
           (size_t)flatcc_json_printer_get_buffer
                             ((flatcc_json_printer_t *)local_288,(size_t *)&builder.refmap);
      if (((char *)flatbuffer_size != (char *)0x0) &&
         (iVar2 = strcmp(_parse_flags_local,(char *)flatbuffer_size), iVar2 == 0)) {
        local_30 = 0;
        goto LAB_00107634;
      }
      fprintf(_stderr,"%d: json test: printed buffer not as expected, got:\n",(ulong)(uint)line);
      fprintf(_stderr,"%s\n",flatbuffer_size);
      fprintf(_stderr,"expected:\n");
      fprintf(_stderr,"%s\n",_parse_flags_local);
    }
    else {
      pcVar3 = flatcc_verify_error_string(local_30);
      fprintf(pFVar1,"%s:%d: buffer verification failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/json_test/test_json.c"
              ,(ulong)(uint)line,pcVar3);
    }
  }
  else {
    if (print_flags_local == 0) {
      pcVar3 = flatcc_json_parser_error_string(flatbuffer._4_4_);
      fprintf(pFVar1,"%d: json test: parse failed: %s\n",(ulong)(uint)line,pcVar3);
      fprintf(_stderr,"%s\n",expect_local);
    }
    else if (flatbuffer._4_4_ == 0) {
      pcVar3 = flatcc_json_parser_error_string(print_flags_local);
      fprintf(pFVar1,"%d: json test: parse successful, but expected to fail with: %s\n",
              (ulong)(uint)line,pcVar3);
      fprintf(_stderr,"%s\n",expect_local);
    }
    else {
      pcVar3 = flatcc_json_parser_error_string(flatbuffer._4_4_);
      fprintf(pFVar1,"%d: json test: parse failed with: %s\n",(ulong)(uint)line,pcVar3);
      pFVar1 = _stderr;
      pcVar3 = flatcc_json_parser_error_string(print_flags_local);
      fprintf(pFVar1,"but expected to fail with: %s\n",pcVar3);
      fprintf(_stderr,"%s\n",expect_local);
    }
    for (local_28c = 0; local_28c < parser_ctx.unquoted + -1; local_28c = local_28c + 1) {
      fprintf(_stderr," ");
    }
    fprintf(_stderr,"^\n");
  }
  if (buf != (char *)0x0) {
    hexdump("parsed buffer",buf,buf_size,(FILE *)_stderr);
  }
  local_30 = -1;
LAB_00107634:
  flatcc_builder_aligned_free(buf);
  flatcc_builder_clear((flatcc_builder_t *)&B);
  flatcc_json_printer_clear((flatcc_json_printer_t *)local_288);
  return local_30;
}

Assistant:

int test_json(const struct test_scope *scope, char *json,
        char *expect, int expect_err,
        flatcc_json_parser_flags_t parse_flags, flatcc_json_printer_flags_t print_flags, int line)
{
    int ret = -1;
    int err;
    void *flatbuffer = 0;
    char *buf = 0;
    size_t flatbuffer_size, buf_size;
    flatcc_builder_t builder, *B;
    flatcc_json_parser_t parser_ctx;
    flatcc_json_printer_t printer_ctx;
    int i;

    B = &builder;
    flatcc_builder_init(B);
    flatcc_json_printer_init_dynamic_buffer(&printer_ctx, 0);
    flatcc_json_printer_set_flags(&printer_ctx, print_flags);
    err = flatcc_json_parser_table_as_root(B, &parser_ctx, json, strlen(json), parse_flags,
            scope->identifier, scope->parser);
    if (err != expect_err) {
        if (expect_err) {
            if (err) {
                fprintf(stderr, "%d: json test: parse failed with: %s\n",
                        line, flatcc_json_parser_error_string(err));
                fprintf(stderr, "but expected to fail with: %s\n",
                        flatcc_json_parser_error_string(expect_err));
                fprintf(stderr, "%s\n", json);
            } else {
                fprintf(stderr, "%d: json test: parse successful, but expected to fail with: %s\n",
                        line, flatcc_json_parser_error_string(expect_err));
                fprintf(stderr, "%s\n", json);
            }
        } else {
            fprintf(stderr, "%d: json test: parse failed: %s\n", line, flatcc_json_parser_error_string(err));
            fprintf(stderr, "%s\n", json);
        }
        for (i = 0; i < parser_ctx.pos - 1; ++i) {
            fprintf(stderr, " ");
        }
        fprintf(stderr, "^\n");
        goto failed;
    }
    if (expect_err) {
        ret = 0;
        goto done;
    }
    flatbuffer = flatcc_builder_finalize_aligned_buffer(B, &flatbuffer_size);
    if ((ret = flatcc_verify_table_as_root(flatbuffer, flatbuffer_size, scope->identifier, scope->verifier))) {
        fprintf(stderr, "%s:%d: buffer verification failed: %s\n",
                __FILE__, line, flatcc_verify_error_string(ret));
        goto failed;
    }

    flatcc_json_printer_table_as_root(&printer_ctx, flatbuffer, flatbuffer_size, scope->identifier, scope->printer);
    buf = flatcc_json_printer_get_buffer(&printer_ctx, &buf_size);
    if (!buf || strcmp(expect, buf)) {
        fprintf(stderr, "%d: json test: printed buffer not as expected, got:\n", line);
        fprintf(stderr, "%s\n", buf);
        fprintf(stderr, "expected:\n");
        fprintf(stderr, "%s\n", expect);
        goto failed;
    }
    ret = 0;

done:
    flatcc_builder_aligned_free(flatbuffer);
    flatcc_builder_clear(B);
    flatcc_json_printer_clear(&printer_ctx);
    return ret;

failed:
    if (flatbuffer) {
        hexdump("parsed buffer", flatbuffer, flatbuffer_size, stderr);
    }
    ret = -1;
    goto done;
}